

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  int in_ESI;
  long in_RDI;
  ImVec2 *in_R8;
  ImVec2 *in_R9;
  ImVec2 IVar1;
  ImVec2 size;
  ImVec2 pos;
  ImFontAtlasCustomRect *r;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ImVector<ImFontAtlasCustomRect> *in_stack_ffffffffffffff40;
  ImVec2 local_50;
  ImVec2 local_48;
  ImFontAtlasCustomRect *local_40;
  ImVec2 *local_38;
  ImVec2 *local_30;
  ImVec2 *local_28;
  ImVec2 *local_20;
  int local_14;
  bool local_1;
  
  if ((in_ESI < 0) || (8 < in_ESI)) {
    local_1 = false;
  }
  else if ((*(uint *)(in_RDI + 4) & 2) == 0) {
    if (*(int *)(in_RDI + 0x70) == -1) {
      __assert_fail("CustomRectIds[0] != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x751,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_40 = ImVector<ImFontAtlasCustomRect>::operator[]
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    ImVec2::ImVec2(&local_50,(float)local_40->X,(float)local_40->Y);
    local_48 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (ImVec2 *)0x1a7f30);
    *local_28 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[local_14][1];
    *local_20 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[local_14][2];
    IVar1 = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (ImVec2 *)0x1a7fa0);
    *local_30 = IVar1;
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
              (ImVec2 *)0x1a7fca);
    IVar1 = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (ImVec2 *)0x1a7fdf);
    local_30[1] = IVar1;
    local_48.x = local_48.x + 109.0;
    IVar1 = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (ImVec2 *)0x1a8023);
    *local_38 = IVar1;
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
              (ImVec2 *)0x1a8048);
    IVar1 = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (ImVec2 *)0x1a805d);
    local_38[1] = IVar1;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}